

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::DisposeBottomPt(Clipper *this,OutRec *outRec)

{
  OutPt *pOVar1;
  OutPt *pOVar2;
  OutPt *pOVar3;
  
  pOVar1 = outRec->bottomPt;
  pOVar2 = pOVar1->next;
  pOVar3 = pOVar1->prev;
  if (outRec->pts == pOVar1) {
    outRec->pts = pOVar2;
  }
  operator_delete(pOVar1,0x28);
  pOVar2->prev = pOVar3;
  pOVar3->next = pOVar2;
  outRec->bottomPt = pOVar2;
  FixupOutPolygon(this,outRec);
  return;
}

Assistant:

void Clipper::DisposeBottomPt(OutRec &outRec)
{
  OutPt* next = outRec.bottomPt->next;
  OutPt* prev = outRec.bottomPt->prev;
  if (outRec.pts == outRec.bottomPt) outRec.pts = next;
  delete outRec.bottomPt;
  next->prev = prev;
  prev->next = next;
  outRec.bottomPt = next;
  FixupOutPolygon(outRec);
}